

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::SmallVector<wasm::HeapType,_1UL>::push_back
          (SmallVector<wasm::HeapType,_1UL> *this,HeapType *x)

{
  if (this->usedFixed != 0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(&this->flexible,x);
    return;
  }
  this->usedFixed = 1;
  (this->fixed)._M_elems[0].id = x->id;
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }